

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

int mu_checkbox(mu_Context *ctx,char *label,int *state)

{
  long lVar1;
  mu_Id id;
  ulong uVar2;
  ulong uVar3;
  mu_Rect rect;
  mu_Rect rect_00;
  mu_Rect rect_01;
  mu_Rect rect_02;
  int local_54;
  int *state_local;
  
  state_local = state;
  id = mu_get_id(ctx,&state_local,8);
  rect = mu_layout_next(ctx);
  uVar2 = rect._0_8_;
  uVar3 = rect._8_8_ & 0xffffffff00000000;
  lVar1 = uVar3 + (rect._8_8_ >> 0x20);
  local_54 = 0;
  mu_update_control(ctx,id,rect,0);
  if ((ctx->mouse_pressed == 1) && (ctx->focus == id)) {
    *state = (uint)(*state == 0);
    local_54 = 4;
  }
  rect_00._8_8_ = lVar1;
  rect_00.x = (int)uVar2;
  rect_00.y = (int)(uVar2 >> 0x20);
  mu_draw_control_frame(ctx,id,rect_00,9,0);
  if (*state != 0) {
    rect_01._8_8_ = lVar1;
    rect_01.x = (int)uVar2;
    rect_01.y = (int)(uVar2 >> 0x20);
    mu_draw_icon(ctx,2,rect_01,ctx->style->colors[0]);
  }
  rect_02._0_8_ = (ulong)(uint)(rect.x + rect.h) | uVar2 & 0xffffffff00000000;
  uVar3 = (uint)(rect.w - rect.h) | uVar3;
  rect_02.w = (int)uVar3;
  rect_02.h = (int)(uVar3 >> 0x20);
  mu_draw_control_text(ctx,label,rect_02,0,0);
  return local_54;
}

Assistant:

int mu_checkbox(mu_Context *ctx, const char *label, int *state) {
  int res = 0;
  mu_Id id = mu_get_id(ctx, &state, sizeof(state));
  mu_Rect r = mu_layout_next(ctx);
  mu_Rect box = mu_rect(r.x, r.y, r.h, r.h);
  mu_update_control(ctx, id, r, 0);
  /* handle click */
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->focus == id) {
    res |= MU_RES_CHANGE;
    *state = !*state;
  }
  /* draw */
  mu_draw_control_frame(ctx, id, box, MU_COLOR_BASE, 0);
  if (*state) {
    mu_draw_icon(ctx, MU_ICON_CHECK, box, ctx->style->colors[MU_COLOR_TEXT]);
  }
  r = mu_rect(r.x + box.w, r.y, r.w - box.w, r.h);
  mu_draw_control_text(ctx, label, r, MU_COLOR_TEXT, 0);
  return res;
}